

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

Task * __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,false,false>::
malloc<depspawn::internal::TaskPool*,depspawn::internal::Workitem*&,std::_Bind<void(*(std::reference_wrapper<double[1500]>))(double(&)[1500])>>
          (LinkedListPool<depspawn::internal::TaskPool::Task,false,false> *this,TaskPool **args,
          Workitem **args_1,
          _Bind<void_(*(std::reference_wrapper<double[1500]>))(double_(&)[1500])> *args_2)

{
  TaskPool *pTVar1;
  Workitem *pWVar2;
  Task *this_00;
  
  this_00 = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                      ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)this);
  pTVar1 = *args;
  pWVar2 = *args_1;
  std::function<void()>::
  function<std::_Bind<void(*(std::reference_wrapper<double[1500]>))(double(&)[1500])>,void>
            ((function<void()> *)this_00,args_2);
  this_00->ctx_ = pWVar2;
  this_00->next = (Task *)pTVar1;
  return this_00;
}

Assistant:

T* malloc(Args&&... args)
   {
     T * const ret = this->intl_malloc();
     new (ret) T(std::forward<Args>(args)...);
     return ret;
   }